

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one_valus_inst.c
# Opt level: O0

void i64Ctz_op(vm *v,instruction *inst)

{
  undefined8 local_30;
  uint64 count;
  uint64 val;
  stack *s;
  instruction *inst_local;
  vm *v_local;
  
  count = popU64(&v->operandStack);
  local_30 = 0x40;
  for (; count != 0; count = count << 1) {
    local_30 = local_30 - 1;
  }
  pushU64(&v->operandStack,local_30);
  return;
}

Assistant:

void i64Ctz_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    uint64 val = popU64(s);
    uint64 count = sizeof(uint64) * 8;
    while (val != 0) {
        val <<= 1;
        count--;
    }
    pushU64(s, count);
}